

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O0

void ON_SortUnsignedIntArray(sort_algorithm sort_algorithm,uint *a,size_t nel)

{
  size_t nel_local;
  uint *a_local;
  sort_algorithm sort_algorithm_local;
  
  if (sort_algorithm == heap_sort) {
    ON_hsort_uint(a,nel);
  }
  else {
    ON_qsort_uint(a,nel);
  }
  return;
}

Assistant:

void ON_SortUnsignedIntArray(
        ON::sort_algorithm sort_algorithm,
        unsigned int* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_uint(a,nel);
  else
    ON_qsort_uint(a,nel);
}